

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void lowbd_fwd_txfm2d_16x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  uint uVar3;
  bool bVar4;
  int8_t *piVar5;
  undefined7 in_register_00000009;
  __m256i *out;
  long lVar6;
  __m256i buf0 [32];
  __m256i buf1 [32];
  longlong local_860 [64];
  longlong local_660 [64];
  longlong local_460 [64];
  longlong alStack_260 [70];
  
  piVar5 = av1_fwd_txfm_shift_ls[9];
  uVar3 = (uint)CONCAT71(in_register_00000009,tx_type);
  pcVar1 = *(code **)((long)col_txfm16x32_arr + (ulong)(uVar3 * 8));
  pcVar2 = *(code **)((long)row_txfm16x16_arr + (ulong)(uVar3 * 8));
  bVar4 = false;
  if (uVar3 < 0x10) {
    if ((0x4110U >> (uVar3 & 0x1f) & 1) != 0) {
LAB_003d3dc0:
      load_buffer_16bit_to_16bit_flip_avx2(input,stride,(__m256i *)local_860,0x20);
      goto LAB_003d3dd2;
    }
    if ((0x80a0U >> (uVar3 & 0x1f) & 1) == 0) {
      if (uVar3 == 6) {
        bVar4 = true;
        goto LAB_003d3dc0;
      }
    }
    else {
      bVar4 = true;
    }
  }
  load_buffer_16bit_to_16bit_avx2(input,stride,(__m256i *)local_860,0x20);
LAB_003d3dd2:
  round_shift_16bit_w16_avx2((__m256i *)local_860,0x20,(int)*piVar5);
  (*pcVar1)((__m256i *)local_860,(__m256i *)local_860,0xc);
  round_shift_16bit_w16_avx2((__m256i *)local_860,0x20,(int)piVar5[1]);
  transpose_16bit_16x16_avx2((__m256i *)local_860,(__m256i *)local_460);
  transpose_16bit_16x16_avx2((__m256i *)local_660,(__m256i *)alStack_260);
  for (lVar6 = 0; lVar6 != 0x400; lVar6 = lVar6 + 0x200) {
    out = (__m256i *)((long)local_460 + lVar6);
    if (bVar4) {
      out = (__m256i *)local_860;
      flip_buf_avx2((__m256i *)((long)local_460 + lVar6),out,0x10);
    }
    (*pcVar2)(out,out,0xd);
    round_shift_16bit_w16_avx2(out,0x10,(int)piVar5[2]);
    store_rect_buffer_16bit_to_32bit_w16_avx2(out,output,0x20,0x10);
    output = output + 0x10;
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_16x32_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_16X32;
  __m256i buf0[32], buf1[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x32_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x16_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip_avx2(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit_avx2(input, stride, buf0, height);
  }
  round_shift_16bit_w16_avx2(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit_w16_avx2(buf0, height, shift[1]);
  transpose_16bit_16x16_avx2(buf0, buf1);
  transpose_16bit_16x16_avx2(buf0 + 16, buf1 + 16);

  for (int i = 0; i < 2; i++) {
    __m256i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_avx2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_rect_buffer_16bit_to_32bit_w16_avx2(buf, output + i * 16, height,
                                              width);
  }
}